

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<ProjectBuilderSources>::relocate
          (QArrayDataPointer<ProjectBuilderSources> *this,qsizetype offset,
          ProjectBuilderSources **data)

{
  bool bVar1;
  ProjectBuilderSources *in_RDX;
  long in_RSI;
  ProjectBuilderSources *in_RDI;
  ProjectBuilderSources **unaff_retaddr;
  ProjectBuilderSources *res;
  Data *n;
  ProjectBuilderSources *c;
  
  n = (in_RDI->key).d.d + in_RSI * 5;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<ProjectBuilderSources,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (ProjectBuilderSources *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<ProjectBuilderSources>,ProjectBuilderSources_const*>
                        (unaff_retaddr,(QArrayDataPointer<ProjectBuilderSources> *)c), bVar1)) {
    *(long *)in_RDX = in_RSI * 0x50 + *(long *)in_RDX;
  }
  (in_RDI->key).d.d = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }